

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O2

bool __thiscall QSslSocketPrivate::verifyProtocolSupported(QSslSocketPrivate *this,char *where)

{
  SslProtocol SVar1;
  QLoggingCategory *pQVar2;
  QDebug *pQVar3;
  bool bVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  QLatin1StringView t;
  qsizetype qStack_60;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  QDebug local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  SVar1 = (this->configuration).protocol;
  if ((uint)(SVar1 + ~TlsV1_2OrLater) < 4) {
    pcVar5 = "DTLS";
    qStack_60 = 4;
  }
  else {
    bVar4 = true;
    if (SVar1 != UnknownProtocol) goto LAB_0022fe79;
    pcVar5 = "UnknownProtocol";
    qStack_60 = 0xf;
  }
  pQVar2 = QtPrivateLogging::lcSsl();
  if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
    local_40 = pQVar2->name;
    local_58.d._0_4_ = 2;
    local_58._4_8_ = 0;
    local_58._12_8_ = 0;
    local_58.size._4_4_ = 0;
    QMessageLogger::warning();
    pQVar3 = QDebug::operator<<(&local_38,where);
    pQVar3 = QDebug::operator<<(pQVar3,"QSslConfiguration with unexpected protocol");
    t.m_data = pcVar5;
    t.m_size = qStack_60;
    QDebug::operator<<(pQVar3,t);
    QDebug::~QDebug(&local_38);
  }
  bVar4 = false;
  QSslSocket::tr((QString *)&local_58,"Attempted to use an unsupported protocol.",(char *)0x0,-1);
  QAbstractSocketPrivate::setErrorAndEmit
            ((QAbstractSocketPrivate *)this,SslInvalidUserDataError,(QString *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_0022fe79:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QSslSocketPrivate::verifyProtocolSupported(const char *where)
{
    auto protocolName = "DTLS"_L1;
    switch (configuration.protocol) {
    case QSsl::UnknownProtocol:
        // UnknownProtocol, according to our docs, is for cipher whose protocol is unknown.
        // Should not be used when configuring QSslSocket.
        protocolName = "UnknownProtocol"_L1;
        Q_FALLTHROUGH();
QT_WARNING_PUSH
QT_WARNING_DISABLE_DEPRECATED
    case QSsl::DtlsV1_0:
    case QSsl::DtlsV1_2:
    case QSsl::DtlsV1_0OrLater:
    case QSsl::DtlsV1_2OrLater:
        qCWarning(lcSsl) << where << "QSslConfiguration with unexpected protocol" << protocolName;
        setErrorAndEmit(QAbstractSocket::SslInvalidUserDataError,
                        QSslSocket::tr("Attempted to use an unsupported protocol."));
        return false;
QT_WARNING_POP
    default:
        return true;
    }
}